

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O1

void flatbuffers::anon_unknown_101::CopyInline
               (FlatBufferBuilder *fbb,Field *fielddef,Table *table,size_t align,size_t size)

{
  uint *puVar1;
  ushort uVar2;
  voffset_t field;
  uint8_t *__dest;
  Table *__src;
  
  if (fbb->minalign_ < align) {
    fbb->minalign_ = align;
  }
  vector_downward<unsigned_int>::fill(&fbb->buf_,align - 1 & -(ulong)(fbb->buf_).size_);
  if (*(ushort *)(fielddef + -(long)*(int *)fielddef) < 0xb) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(ushort *)(fielddef + (10 - (long)*(int *)fielddef));
  }
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(ushort *)(fielddef + uVar2);
  }
  if (uVar2 < *(ushort *)(table + -(long)*(int *)table)) {
    uVar2 = *(ushort *)(table + ((ulong)uVar2 - (long)*(int *)table));
  }
  else {
    uVar2 = 0;
  }
  if (size != 0) {
    __src = (Table *)0x0;
    if (uVar2 != 0) {
      __src = table + uVar2;
    }
    vector_downward<unsigned_int>::ensure_space(&fbb->buf_,size);
    __dest = (fbb->buf_).cur_ + -size;
    (fbb->buf_).cur_ = __dest;
    puVar1 = &(fbb->buf_).size_;
    *puVar1 = *puVar1 + (int)size;
    memcpy(__dest,__src,size);
  }
  if (*(ushort *)(fielddef + -(long)*(int *)fielddef) < 0xb) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(ushort *)(fielddef + (10 - (long)*(int *)fielddef));
  }
  if (uVar2 == 0) {
    field = 0;
  }
  else {
    field = *(voffset_t *)(fielddef + uVar2);
  }
  FlatBufferBuilderImpl<false>::TrackField(fbb,field,(fbb->buf_).size_);
  return;
}

Assistant:

static void CopyInline(FlatBufferBuilder &fbb,
                       const reflection::Field &fielddef, const Table &table,
                       size_t align, size_t size) {
  fbb.Align(align);
  fbb.PushBytes(table.GetStruct<const uint8_t *>(fielddef.offset()), size);
  fbb.TrackField(fielddef.offset(), fbb.GetSize());
}